

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O1

void __thiscall Centaurus::NFA<char>::parse(NFA<char> *this,Stream *stream)

{
  wchar_t ch;
  NFA<char> nfa;
  NFA<char> local_50;
  
  ch = Stream::get(stream);
  while ((0x2f < (uint)ch || ((0x820000000001U >> ((ulong)(uint)ch & 0x3f) & 1) == 0))) {
    NFA(&local_50);
    parse_selection(&local_50,stream,ch);
    concat(this,&local_50);
    local_50.super_NFABase<Centaurus::NFABaseState<char,_int>_>._vptr_NFABase =
         (_func_int **)&PTR__NFABase_001a71f8;
    std::
    vector<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
    ::~vector(&local_50.super_NFABase<Centaurus::NFABaseState<char,_int>_>.m_states);
    ch = Stream::get(stream);
  }
  return;
}

Assistant:

void parse(Stream& stream)
    {
        for (wchar_t ch = stream.get(); ch != L')' && ch != L'/' && ch != L'\0'; ch = stream.get())
        {
            NFA<TCHAR> nfa;
            nfa.parse_selection(stream, ch);
            concat(nfa);
        }
    }